

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O0

void __thiscall glcts::TessellationShaderTCTEgl_in::initTest(TessellationShaderTCTEgl_in *this)

{
  int iVar1;
  deUint32 dVar2;
  GLuint GVar3;
  NotSupportedError *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *this_01;
  MessageBuilder *pMVar5;
  TestError *pTVar6;
  GLint local_26c;
  GLchar **ppGStack_268;
  GLint xfb_size;
  GLchar **xfb_varyings;
  GLint n_xfb_varyings;
  GLint link_status;
  MessageBuilder local_238;
  char *local_b8;
  char *src [4];
  GLuint shader;
  GLint compile_status;
  uint n_shader;
  uint n_shaders;
  GLuint shaders [4];
  char *local_70;
  char *vs_body;
  char *te_body;
  char *tc_body;
  char *fs_body;
  Functions *gl;
  allocator<char> local_31;
  string local_30;
  TessellationShaderTCTEgl_in *local_10;
  TessellationShaderTCTEgl_in *this_local;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) {
    gl._3_1_ = 1;
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Tessellation shader functionality not supported, skipping",
               &local_31);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
    gl._3_1_ = 0;
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  fs_body = (char *)CONCAT44(extraout_var,iVar1);
  (**(code **)(fs_body + 0x708))(1,&this->m_vao_id);
  dVar2 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar2,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x500);
  (**(code **)(fs_body + 0xd8))(this->m_vao_id);
  dVar2 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar2,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x503);
  GVar3 = (**(code **)(fs_body + 0x3c8))();
  this->m_po_id = GVar3;
  dVar2 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar2,"glCreateProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x508);
  GVar3 = (**(code **)(fs_body + 0x3f0))(0x8b30);
  this->m_fs_id = GVar3;
  GVar3 = (**(code **)(fs_body + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER);
  this->m_tcs_id = GVar3;
  GVar3 = (**(code **)(fs_body + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
  this->m_tes_id = GVar3;
  GVar3 = (**(code **)(fs_body + 0x3f0))(0x8b31);
  this->m_vs_id = GVar3;
  dVar2 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar2,"glCreateShader() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x510);
  tc_body = "${VERSION}\n\nvoid main()\n{\n}\n";
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_fs_id,1,&tc_body);
  dVar2 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar2,"glShaderSource() failed for fragment shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x51a);
  te_body = 
  "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = 1) out;\n\nout float out_float[];\nout int   out_int[];\nout ivec3 out_ivec3[];\nout mat2  out_mat2[];\nout uint  out_uint[];\nout uvec2 out_uvec2[];\nout vec4  out_vec4[];\n\nout struct\n{\n    int   test1;\n    float test2;\n} out_struct[];\nvoid main()\n{\n    gl_out           [gl_InvocationID].gl_Position = vec4(5.0, 6.0, 7.0, 8.0);\n    gl_TessLevelOuter[0]                           = 1.0;\n    gl_TessLevelOuter[1]                           = 1.0;\n\n    out_float[gl_InvocationID] = 22.0;\n    out_int  [gl_InvocationID] = 23;\n    out_ivec3[gl_InvocationID] = ivec3(24, 25, 26);\n    out_mat2 [gl_InvocationID] = mat2(vec2(27.0, 28.0), vec2(29.0, 30.0) );\n    out_uint [gl_InvocationID] = 31u;\n    out_uvec2[gl_InvocationID] = uvec2(32, 33);\n    out_vec4 [gl_InvocationID] = vec4(34.0, 35.0, 36.0, 37.0);\n\n    out_struct[gl_InvocationID].test1 = 38;\n    out_struct[gl_InvocationID].test2 = 39.0;\n}\n"
  ;
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_tcs_id,1,&te_body);
  dVar2 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar2,"glShaderSource() failed for tessellation control shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x545);
  vs_body = 
  "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (isolines, point_mode) in;\n\nin float out_float[];\nin int   out_int[];\nin ivec3 out_ivec3[];\nin mat2  out_mat2[];\nin uint  out_uint[];\nin uvec2 out_uvec2[];\nin vec4  out_vec4[];\nin struct\n{\n    int   test1;\n    float test2;\n} out_struct[];\n\nout float result_float;\nflat out int   result_int;\nflat out ivec3 result_ivec3;\nout mat2  result_mat2;\nflat out int   result_struct_test1;\nout float result_struct_test2;\nflat out uint  result_uint;\nflat out uvec2 result_uvec2;\nout vec4  result_vec4;\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n\n    result_float        = out_float [0];\n    result_int          = out_int   [0];\n    result_ivec3        = out_ivec3 [0];\n    result_mat2         = out_mat2  [0];\n    result_struct_test1 = out_struct[0].test1;\n    result_struct_test2 = out_struct[0].test2;\n    result_uint         = out_uint  [0];\n    result_uvec2        = out_uvec2 [0];\n    result_vec4         = out_vec4  [0];\n}\n"
  ;
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_tes_id,1,&vs_body);
  dVar2 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar2,"glShaderSource() failed for tessellation evaluation shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x575);
  local_70 = 
  "${VERSION}\n\n${SHADER_IO_BLOCKS_ENABLE}\n\nout float out_float;\nflat out int   out_int;\nflat out ivec3 out_ivec3;\nout mat2  out_mat2;\nflat out uint  out_uint;\nflat out uvec2 out_uvec2;\nout vec4  out_vec4;\n\nflat out struct\n{\n    int   test1;\n    float test2;\n} out_struct;\n\nvoid main()\n{\n    gl_Position = vec4(1.0, 2.0, 3.0, 4.0);\n\n    out_float        = 1.0;\n    out_int          = 2;\n    out_ivec3        = ivec3(3, 4, 5);\n    out_mat2         = mat2(vec2(6.0, 7.0), vec2(8.0, 9.0) );\n    out_uint         = 10u;\n    out_uvec2        = uvec2(11u, 12u);\n    out_vec4         = vec4(12.0, 13.0, 14.0, 15.0);\n    out_struct.test1 = 20;\n    out_struct.test2 = 21.0;\n}\n"
  ;
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_vs_id,1,&local_70);
  dVar2 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar2,"glShaderSource() failed for vertex shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x59a);
  n_shader = this->m_fs_id;
  n_shaders = this->m_tcs_id;
  shaders[0] = this->m_tes_id;
  shaders[1] = this->m_vs_id;
  compile_status = 4;
  shader = 0;
  while( true ) {
    if (3 < shader) {
      xfb_varyings._4_4_ = 0;
      xfb_varyings._0_4_ = 0;
      ppGStack_268 = (GLchar **)0x0;
      local_26c = 0;
      getXFBProperties(this,&stack0xfffffffffffffd98,(GLint *)&xfb_varyings,&local_26c);
      (**(code **)(fs_body + 0x14c8))(this->m_po_id,xfb_varyings._0_4_,ppGStack_268,0x8c8c);
      dVar2 = (**(code **)(fs_body + 0x800))();
      glu::checkError(dVar2,"glTransformFeedbackVaryings() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0x5c1);
      (**(code **)(fs_body + 0x10))(this->m_po_id,this->m_fs_id);
      (**(code **)(fs_body + 0x10))(this->m_po_id,this->m_tcs_id);
      (**(code **)(fs_body + 0x10))(this->m_po_id,this->m_tes_id);
      (**(code **)(fs_body + 0x10))(this->m_po_id,this->m_vs_id);
      dVar2 = (**(code **)(fs_body + 0x800))();
      glu::checkError(dVar2,"glAttachShader() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0x5c7);
      (**(code **)(fs_body + 0xce8))(this->m_po_id);
      dVar2 = (**(code **)(fs_body + 0x800))();
      glu::checkError(dVar2,"glLinkProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0x5ca);
      (**(code **)(fs_body + 0x9d8))(this->m_po_id,0x8b82,(long)&xfb_varyings + 4);
      dVar2 = (**(code **)(fs_body + 0x800))();
      glu::checkError(dVar2,"glGetProgramiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0x5cd);
      if (xfb_varyings._4_4_ != 1) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,"Program linking failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                   ,0x5d1);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (**(code **)(fs_body + 0x6c8))(1,&this->m_bo_id);
      dVar2 = (**(code **)(fs_body + 0x800))();
      glu::checkError(dVar2,"glGenBuffers() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0x5d6);
      (**(code **)(fs_body + 0x40))(0x8c8e,this->m_bo_id);
      dVar2 = (**(code **)(fs_body + 0x800))();
      glu::checkError(dVar2,"glBindBuffer() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0x5d9);
      (**(code **)(fs_body + 0x48))(0x8c8e,0,this->m_bo_id);
      dVar2 = (**(code **)(fs_body + 0x800))();
      glu::checkError(dVar2,"glBindBufferBase() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0x5db);
      (**(code **)(fs_body + 0x150))(0x8c8e,(long)local_26c,0,0x88e4);
      dVar2 = (**(code **)(fs_body + 0x800))();
      glu::checkError(dVar2,"glBufferData() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0x5de);
      return;
    }
    src[3]._4_4_ = 0;
    src[3]._0_4_ = (&n_shader)[shader];
    (**(code **)(fs_body + 0x248))((uint)src[3]);
    dVar2 = (**(code **)(fs_body + 0x800))();
    glu::checkError(dVar2,"glCompileShader() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x5a6);
    (**(code **)(fs_body + 0xa70))((uint)src[3],0x8b81,(long)src + 0x1c);
    dVar2 = (**(code **)(fs_body + 0x800))();
    glu::checkError(dVar2,"glGetShaderiv() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x5a9);
    if (src[3]._4_4_ != 1) break;
    shader = shader + 1;
  }
  local_b8 = tc_body;
  src[0] = te_body;
  src[1] = vs_body;
  src[2] = local_70;
  this_01 = tcu::TestContext::getLog
                      ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_238,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (&local_238,(char (*) [39])"Compilation of shader object at index ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&shader);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [10])0x2a46934);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])"Info log:\n");
  TestCaseBase::getCompilationInfoLog_abi_cxx11_
            ((string *)&n_xfb_varyings,&this->super_TestCaseBase,(uint)src[3]);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &n_xfb_varyings);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [9])0x2b155ca);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,src + ((ulong)shader - 1));
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&n_xfb_varyings);
  tcu::MessageBuilder::~MessageBuilder(&local_238);
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar6,"Shader compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
             ,0x5b4);
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void TessellationShaderTCTEgl_in::initTest()
{
	/* The test requires EXT_tessellation_shader */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Generate a program object we will later configure */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Create program object */
	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed");

	/* Generate shader objects the test will use */
	m_fs_id  = gl.createShader(GL_FRAGMENT_SHADER);
	m_tcs_id = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
	m_tes_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
	m_vs_id  = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() failed");

	/* Configure fragment shader */
	const char* fs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "}\n";

	shaderSourceSpecialized(m_fs_id, 1 /* count */, &fs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for fragment shader object");

	/* Configure tessellation control shader */
	const char* tc_body = "${VERSION}\n"
						  "\n"
						  /* Required EXT_tessellation_shader functionality */
						  "${TESSELLATION_SHADER_REQUIRE}\n"
						  "\n"
						  "layout (vertices = 1) out;\n"
						  "\n"
						  "out float out_float[];\n"
						  "out int   out_int[];\n"
						  "out ivec3 out_ivec3[];\n"
						  "out mat2  out_mat2[];\n"
						  "out uint  out_uint[];\n"
						  "out uvec2 out_uvec2[];\n"
						  "out vec4  out_vec4[];\n"
						  "\n"
						  "out struct\n"
						  "{\n"
						  "    int   test1;\n"
						  "    float test2;\n"
						  "} out_struct[];\n"
						  /* Body */
						  "void main()\n"
						  "{\n"
						  "    gl_out           [gl_InvocationID].gl_Position = vec4(5.0, 6.0, 7.0, 8.0);\n"
						  "    gl_TessLevelOuter[0]                           = 1.0;\n"
						  "    gl_TessLevelOuter[1]                           = 1.0;\n"
						  "\n"
						  "    out_float[gl_InvocationID] = 22.0;\n"
						  "    out_int  [gl_InvocationID] = 23;\n"
						  "    out_ivec3[gl_InvocationID] = ivec3(24, 25, 26);\n"
						  "    out_mat2 [gl_InvocationID] = mat2(vec2(27.0, 28.0), vec2(29.0, 30.0) );\n"
						  "    out_uint [gl_InvocationID] = 31u;\n"
						  "    out_uvec2[gl_InvocationID] = uvec2(32, 33);\n"
						  "    out_vec4 [gl_InvocationID] = vec4(34.0, 35.0, 36.0, 37.0);\n"
						  "\n"
						  "    out_struct[gl_InvocationID].test1 = 38;\n"
						  "    out_struct[gl_InvocationID].test2 = 39.0;\n"
						  "}\n";

	shaderSourceSpecialized(m_tcs_id, 1 /* count */, &tc_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation control shader object");

	/* Configure tessellation evaluation shader */
	const char* te_body = "${VERSION}\n"
						  "\n"
						  "${TESSELLATION_SHADER_REQUIRE}\n"
						  "\n"
						  "layout (isolines, point_mode) in;\n"
						  "\n"
						  "in float out_float[];\n"
						  "in int   out_int[];\n"
						  "in ivec3 out_ivec3[];\n"
						  "in mat2  out_mat2[];\n"
						  "in uint  out_uint[];\n"
						  "in uvec2 out_uvec2[];\n"
						  "in vec4  out_vec4[];\n"
						  "in struct\n"
						  "{\n"
						  "    int   test1;\n"
						  "    float test2;\n"
						  "} out_struct[];\n"
						  "\n"
						  "out float result_float;\n"
						  "flat out int   result_int;\n"
						  "flat out ivec3 result_ivec3;\n"
						  "out mat2  result_mat2;\n"
						  "flat out int   result_struct_test1;\n"
						  "out float result_struct_test2;\n"
						  "flat out uint  result_uint;\n"
						  "flat out uvec2 result_uvec2;\n"
						  "out vec4  result_vec4;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = gl_in[0].gl_Position;\n"
						  "\n"
						  "    result_float        = out_float [0];\n"
						  "    result_int          = out_int   [0];\n"
						  "    result_ivec3        = out_ivec3 [0];\n"
						  "    result_mat2         = out_mat2  [0];\n"
						  "    result_struct_test1 = out_struct[0].test1;\n"
						  "    result_struct_test2 = out_struct[0].test2;\n"
						  "    result_uint         = out_uint  [0];\n"
						  "    result_uvec2        = out_uvec2 [0];\n"
						  "    result_vec4         = out_vec4  [0];\n"
						  "}\n";

	shaderSourceSpecialized(m_tes_id, 1 /* count */, &te_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation evaluation shader object");

	/* Configure vertex shader */
	const char* vs_body = "${VERSION}\n"
						  "\n"
						  "${SHADER_IO_BLOCKS_ENABLE}\n"
						  "\n"
						  "out float out_float;\n"
						  "flat out int   out_int;\n"
						  "flat out ivec3 out_ivec3;\n"
						  "out mat2  out_mat2;\n"
						  "flat out uint  out_uint;\n"
						  "flat out uvec2 out_uvec2;\n"
						  "out vec4  out_vec4;\n"
						  "\n"
						  "flat out struct\n"
						  "{\n"
						  "    int   test1;\n"
						  "    float test2;\n"
						  "} out_struct;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = vec4(1.0, 2.0, 3.0, 4.0);\n"
						  "\n"
						  "    out_float        = 1.0;\n"
						  "    out_int          = 2;\n"
						  "    out_ivec3        = ivec3(3, 4, 5);\n"
						  "    out_mat2         = mat2(vec2(6.0, 7.0), vec2(8.0, 9.0) );\n"
						  "    out_uint         = 10u;\n"
						  "    out_uvec2        = uvec2(11u, 12u);\n"
						  "    out_vec4         = vec4(12.0, 13.0, 14.0, 15.0);\n"
						  "    out_struct.test1 = 20;\n"
						  "    out_struct.test2 = 21.0;\n"
						  "}\n";

	shaderSourceSpecialized(m_vs_id, 1 /* count */, &vs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for vertex shader object");

	/* Compile all shaders of our interest */
	const glw::GLuint  shaders[] = { m_fs_id, m_tcs_id, m_tes_id, m_vs_id };
	const unsigned int n_shaders = sizeof(shaders) / sizeof(shaders[0]);

	for (unsigned int n_shader = 0; n_shader < n_shaders; ++n_shader)
	{
		glw::GLint  compile_status = GL_FALSE;
		glw::GLuint shader		   = shaders[n_shader];

		gl.compileShader(shader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed");

		gl.getShaderiv(shader, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed");

		if (compile_status != GL_TRUE)
		{
			const char* src[] = { fs_body, tc_body, te_body, vs_body };
			m_testCtx.getLog() << tcu::TestLog::Message << "Compilation of shader object at index " << n_shader
							   << " failed.\n"
							   << "Info log:\n"
							   << getCompilationInfoLog(shader) << "Shader:\n"
							   << src[n_shader] << tcu::TestLog::EndMessage;

			TCU_FAIL("Shader compilation failed");
		}
	} /* for (all shaders) */

	/* Attach the shaders to the test program object, set up XFB and then link the program */
	glw::GLint			link_status	= GL_FALSE;
	glw::GLint			n_xfb_varyings = 0;
	const glw::GLchar** xfb_varyings   = NULL;
	glw::GLint			xfb_size	   = 0;

	getXFBProperties(&xfb_varyings, &n_xfb_varyings, &xfb_size);

	gl.transformFeedbackVaryings(m_po_id, n_xfb_varyings, xfb_varyings, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed");

	gl.attachShader(m_po_id, m_fs_id);
	gl.attachShader(m_po_id, m_tcs_id);
	gl.attachShader(m_po_id, m_tes_id);
	gl.attachShader(m_po_id, m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed.");

	gl.linkProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed");
	}

	/* Generate and set up a buffer object we will use to hold XFBed data. */
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed");

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_size, NULL /* data */, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed");

	/* We're good to execute the test! */
}